

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::DOMCharacterDataImpl::substringData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count)

{
  short *psVar1;
  short *psVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  XMLCh *target;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  DOMException *this_00;
  MemoryManager **ppMVar8;
  long *plVar9;
  XMLCh *pXVar10;
  XMLCh XVar11;
  undefined8 *puVar12;
  long lVar13;
  XMLCh temp [4096];
  XMLCh aXStack_2038 [4100];
  
  target = aXStack_2038;
  uVar3 = this->fDataBuf->fIndex;
  if (uVar3 < offset) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDoc == (DOMDocumentImpl *)0x0) {
      ppMVar8 = (MemoryManager **)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      ppMVar8 = &this->fDoc->fMemoryManager;
    }
    DOMException::DOMException(this_00,1,0,*ppMVar8);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar4 = (*node->_vptr_DOMNode[0xc])(node);
  plVar9 = (long *)(CONCAT44(extraout_var,iVar4) + -8);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    plVar9 = (long *)0x0;
  }
  if (0xffe < uVar3) {
    target = (XMLCh *)(**(code **)(*(long *)plVar9[0x2c] + 0x18))
                                ((long *)plVar9[0x2c],uVar3 * 2 + 2);
  }
  pXVar10 = this->fDataBuf->fBuffer;
  lVar13 = 0;
  pXVar10[this->fDataBuf->fIndex] = L'\0';
  XMLString::copyNString(target,pXVar10 + offset,count);
  target[count] = L'\0';
  do {
    psVar1 = (short *)((long)target + lVar13);
    lVar13 = lVar13 + 2;
  } while (*psVar1 != 0);
  uVar5 = (ulong)(ushort)*target;
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    XVar11 = target[1];
    if (XVar11 != L'\0') {
      pXVar10 = target + 2;
      do {
        uVar5 = (ulong)(ushort)XVar11 + (uVar5 >> 0x18) + uVar5 * 0x26;
        XVar11 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar11 != L'\0');
    }
    uVar5 = uVar5 % (ulong)plVar9[0x28];
  }
  lVar13 = (lVar13 >> 1) + -1;
  puVar7 = *(undefined8 **)(plVar9[0x27] + uVar5 * 8);
  if (puVar7 == (undefined8 *)0x0) {
    puVar12 = (undefined8 *)(plVar9[0x27] + uVar5 * 8);
  }
  else {
    do {
      puVar12 = puVar7;
      if (puVar12[1] == lVar13) {
        pXVar10 = (XMLCh *)(puVar12 + 2);
        if (pXVar10 == target) goto LAB_0025f751;
        lVar6 = 0;
        do {
          psVar1 = (short *)((long)pXVar10 + lVar6);
          if (*psVar1 == 0) {
            if (*(short *)((long)target + lVar6) == 0) goto LAB_0025f751;
            break;
          }
          psVar2 = (short *)((long)target + lVar6);
          lVar6 = lVar6 + 2;
        } while (*psVar1 == *psVar2);
      }
      puVar7 = (undefined8 *)*puVar12;
    } while ((undefined8 *)*puVar12 != (undefined8 *)0x0);
  }
  puVar7 = (undefined8 *)(**(code **)(*plVar9 + 0x20))(plVar9,lVar13 * 2 + 0x18);
  *puVar12 = puVar7;
  puVar7[1] = lVar13;
  *puVar7 = 0;
  pXVar10 = (XMLCh *)(puVar7 + 2);
  XMLString::copyString(pXVar10,target);
LAB_0025f751:
  if (0xffe < uVar3) {
    (**(code **)(*(long *)plVar9[0x2c] + 0x20))((long *)plVar9[0x2c],target);
  }
  return pXVar10;
}

Assistant:

const XMLCh * DOMCharacterDataImpl::substringData(const DOMNode *node, XMLSize_t offset,
                                           XMLSize_t count) const
{

    // Note: the C++ XMLCh * operation throws the correct DOMExceptions
    //       when parameter values are bad.
    //


    XMLSize_t len = fDataBuf->getLen();

    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    DOMDocumentImpl *doc = (DOMDocumentImpl *)node->getOwnerDocument();

    XMLCh* newString;
    XMLCh temp[4096];
    if (len >= 4095)
      newString = (XMLCh*) doc->getMemoryManager()->allocate
        (
            (len + 1) * sizeof(XMLCh)
        );//new XMLCh[len+1];
    else
        newString = temp;

    XMLString::copyNString(newString, fDataBuf->getRawBuffer()+offset, count);
    newString[count] = chNull;

    const XMLCh* retString = doc->getPooledString(newString);

    if (len >= 4095)
      doc->getMemoryManager()->deallocate(newString);//delete[] newString;

    return retString;

}